

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

size_t bitset_extract_setbits_avx512_uint16
                 (uint64_t *array,size_t length,uint16_t *vout,size_t capacity,uint16_t base)

{
  undefined1 (*pauVar1) [64];
  short sVar2;
  ulong uVar3;
  undefined1 (*pauVar4) [64];
  uint16_t *out;
  ulong uVar5;
  uint64_t uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  
  pauVar1 = (undefined1 (*) [64])(vout + capacity);
  auVar8 = vmovdqa64_avx512f((undefined1  [64])vbmi2_table);
  uVar5 = 0;
  for (pauVar4 = (undefined1 (*) [64])vout; (uVar5 < length && (pauVar4 + 2 < pauVar1));
      pauVar4 = (undefined1 (*) [64])(*pauVar4 + POPCOUNT(uVar6) * 2)) {
    uVar6 = array[uVar5];
    auVar9 = vpcompressb_avx512_vbmi2(auVar8,uVar6);
    auVar10 = vpbroadcastw_avx512bw();
    auVar11 = vpmovsxbw_avx512bw(auVar9._0_32_);
    auVar7 = vextracti64x4_avx512f(auVar9,1);
    auVar9 = vpmovsxbw_avx512bw(auVar7);
    auVar11 = vpaddw_avx512bw(auVar10,auVar11);
    auVar10 = vpaddw_avx512bw(auVar10,auVar9);
    auVar9 = vmovdqu64_avx512f(auVar11);
    *pauVar4 = auVar9;
    auVar9 = vmovdqu64_avx512f(auVar10);
    pauVar4[1] = auVar9;
    uVar5 = uVar5 + 1;
    base = base + 0x40;
  }
  while ((uVar5 < length && (pauVar4 < pauVar1))) {
    uVar6 = array[uVar5];
    for (; (uVar6 != 0 && (pauVar4 < pauVar1)); pauVar4 = (undefined1 (*) [64])(*pauVar4 + 2)) {
      sVar2 = 0;
      for (uVar3 = uVar6; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
        sVar2 = sVar2 + 1;
      }
      *(uint16_t *)*pauVar4 = sVar2 + base;
      uVar6 = uVar6 - 1 & uVar6;
    }
    base = base + 0x40;
    uVar5 = uVar5 + 1;
  }
  return (long)pauVar4 - (long)vout >> 1;
}

Assistant:

size_t bitset_extract_setbits_avx512_uint16(const uint64_t *array,
                                            size_t length, uint16_t *vout,
                                            size_t capacity, uint16_t base) {
    uint16_t *out = (uint16_t *)vout;
    uint16_t *initout = out;
    uint16_t *safeout = vout + capacity;

    __m512i base_v = _mm512_set1_epi16(base);
    __m512i index_table = _mm512_loadu_si512(vbmi2_table);
    size_t i = 0;

    for (; (i < length) && ((out + 64) < safeout); i++) {
        uint64_t v = array[i];
        __m512i vec = _mm512_maskz_compress_epi8(v, index_table);

        uint8_t advance = (uint8_t)roaring_hamming(v);

        __m512i vbase =
            _mm512_add_epi16(base_v, _mm512_set1_epi16((short)(i * 64)));
        __m512i r1 = _mm512_cvtepi8_epi16(_mm512_extracti32x8_epi32(vec, 0));
        __m512i r2 = _mm512_cvtepi8_epi16(_mm512_extracti32x8_epi32(vec, 1));

        r1 = _mm512_add_epi16(r1, vbase);
        r2 = _mm512_add_epi16(r2, vbase);

        _mm512_storeu_si512((__m512i *)out, r1);
        _mm512_storeu_si512((__m512i *)(out + 32), r2);
        out += advance;
    }

    base += i * 64;

    for (; (i < length) && (out < safeout); ++i) {
        uint64_t w = array[i];
        while ((w != 0) && (out < safeout)) {
            int r =
                roaring_trailing_zeroes(w);  // on x64, should compile to TZCNT
            uint32_t val = r + base;
            memcpy(out, &val, sizeof(uint16_t));
            out++;
            w &= (w - 1);
        }
        base += 64;
    }

    return out - initout;
}